

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

RESULT_TYPE_conflict2 __thiscall
duckdb::Interpolator<true>::InterpolateInternal<long,duckdb::QuantileDirect<long>>
          (Interpolator<true> *this,long *v_t,QuantileDirect<long> *accessor)

{
  QuantileCompare<duckdb::QuantileDirect<long>_> __comp;
  undefined7 uStack_17;
  
  __comp._17_7_ = uStack_17;
  __comp.desc = this->desc;
  __comp.accessor_r = accessor;
  __comp.accessor_l = accessor;
  ::std::nth_element<long*,duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp);
  return v_t[this->FRN];
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}